

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc_vector.h
# Opt level: O2

void __thiscall
mjs::gc_vector<mjs::gc_heap_ptr_untracked<mjs::object,_true>_>::ensure_capacity
          (gc_vector<mjs::gc_heap_ptr_untracked<mjs::object,_true>_> *this)

{
  gc_table *pgVar1;
  gc_table local_20;
  
  pgVar1 = tab(this);
  if (pgVar1->length_ == pgVar1->capacity_) {
    gc_table::copy_with_increased_capacity(&local_20,(uint32_t)pgVar1);
    (this->table_).pos_ = local_20.capacity_;
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_20);
  }
  return;
}

Assistant:

void ensure_capacity() {
        auto& t = tab();
        if (t.length() == t.capacity()) {
            table_ = t.copy_with_increased_capacity(2 * t.capacity());
        }
    }